

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationCreator.hpp
# Opt level: O0

void __thiscall OpenMD::OptimizationCreator::~OptimizationCreator(OptimizationCreator *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__OptimizationCreator_004fede0;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

virtual ~OptimizationCreator() {}